

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryResult.cpp
# Opt level: O0

void __thiscall QueryResult::do_and(QueryResult *this,QueryResult *other,QueryCounter *counter)

{
  bool bVar1;
  QueryResult *in_RSI;
  QueryResult *in_RDI;
  QueryOperation op;
  SortedRun *in_stack_00000058;
  SortedRun *in_stack_00000060;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  
  QueryOperation::QueryOperation
            ((QueryOperation *)in_RDI,
             (QueryCounter *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  bVar1 = is_everything(in_RSI);
  if (!bVar1) {
    bVar1 = is_everything(in_RDI);
    if (bVar1) {
      SortedRun::operator=(&in_RDI->results,(SortedRun *)CONCAT17(bVar1,in_stack_ffffffffffffffb8));
      in_RDI->has_everything = (bool)(in_RSI->has_everything & 1);
    }
    else {
      SortedRun::do_and(in_stack_00000060,in_stack_00000058);
    }
  }
  QueryOperation::~QueryOperation((QueryOperation *)in_RSI);
  return;
}

Assistant:

void QueryResult::do_and(QueryResult &&other, QueryCounter *counter) {
    auto op = QueryOperation(counter);
    if (other.is_everything()) {
    } else if (this->is_everything()) {
        results = std::move(other.results);
        has_everything = other.has_everything;
    } else {
        results.do_and(other.results);
    }
}